

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_remove_music.hpp
# Opt level: O1

void __thiscall PatchRemoveMusic::inject_code(PatchRemoveMusic *this,ROM *rom,World *world)

{
  Code *pCVar1;
  Param local_98;
  uint32_t local_90;
  undefined4 local_8c;
  Code local_88;
  
  local_90 = inject_func_check_tree_map(this,rom);
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88._labels._M_t._M_impl._0_8_ = 0;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._pending_branches._M_t._M_impl._0_8_ = 0;
  local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_8c = 2;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar1 = md::Code::jsr(&local_88,&local_98);
  pCVar1 = md::Code::nop(pCVar1,1);
  md::ROM::set_code(rom,0x6310,pCVar1);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_88._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_88._pending_branches._M_t);
  if (local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        // Inject a function checking on the tree maps table to check if we should trigger
        // a "wave-y" teleportation effect or the regular one
        uint32_t func_check_tree_map_addr = inject_func_check_tree_map(rom);
        rom.set_code(0x6310, md::Code().jsr(func_check_tree_map_addr).nop());

        // This code was used to fix the check removing enemies once Tibor had been saved (which was also relying
        // on music). This is not useful anymore with the flexible mapsetup system which attaches the procedure
        // to the correct Tibor maps directly, not relying on music anymore.
        // rom.set_code(0x1A034, md::Code().jsr(func_check_tree_map_addr).nop());
    }